

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

void __thiscall ADPlanner::Recomputegval(ADPlanner *this,ADState *state)

{
  long lVar1;
  size_type sVar2;
  reference pvVar3;
  reference ppiVar4;
  long lVar5;
  long in_RSI;
  long *in_RDI;
  int cost;
  CMDPSTATE *predMDPState;
  int pind;
  ADState *searchpredstate;
  CKey key;
  vector<int,_std::allocator<int>_> costV;
  vector<int,_std::allocator<int>_> searchpredsIDV;
  undefined4 in_stack_ffffffffffffff70;
  int iVar6;
  int local_6c;
  CKey local_50;
  vector<int,_std::allocator<int>_> local_40;
  vector<int,_std::allocator<int>_> local_28;
  long local_10;
  
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x191d41);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x191d4b);
  CKey::CKey(&local_50);
  if ((*(byte *)(in_RDI + 0xe) & 1) == 0) {
    (**(code **)(*(long *)in_RDI[1] + 0x28))
              ((long *)in_RDI[1],**(undefined4 **)(local_10 + 0x18),&local_28,&local_40);
  }
  else {
    (**(code **)(*(long *)in_RDI[1] + 0x58))
              ((long *)in_RDI[1],**(undefined4 **)(local_10 + 0x18),&local_28,&local_40);
  }
  *(undefined4 *)(local_10 + 0x24) = 1000000000;
  local_6c = 0;
  while (iVar6 = local_6c, sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_28),
        iVar6 < (int)sVar2) {
    lVar1 = in_RDI[1];
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)local_6c);
    ppiVar4 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                        ((vector<int_*,_std::allocator<int_*>_> *)(lVar1 + 8),(long)*pvVar3);
    if (**ppiVar4 != -1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)local_6c);
      lVar5 = (**(code **)(*in_RDI + 200))(in_RDI,*pvVar3,in_RDI[0xf]);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_6c);
      iVar6 = *pvVar3;
      lVar1 = *(long *)(lVar5 + 0x38);
      if ((*(short *)(lVar1 + 0x2a) == *(short *)(in_RDI[0xf] + 0x22)) &&
         ((uint)(*(int *)(lVar1 + 0x20) + iVar6) < *(uint *)(local_10 + 0x24))) {
        if ((*(byte *)(in_RDI + 0xe) & 1) == 0) {
          *(int *)(local_10 + 0x24) = *(int *)(lVar1 + 0x20) + iVar6;
          *(long *)(local_10 + 0x38) = lVar5;
          *(int *)(local_10 + 0x40) = iVar6;
        }
        else {
          *(int *)(local_10 + 0x24) = *(int *)(lVar1 + 0x20) + iVar6;
          *(long *)(local_10 + 0x30) = lVar5;
        }
      }
    }
    local_6c = local_6c + 1;
  }
  CKey::~CKey(&local_50);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar6,in_stack_ffffffffffffff70));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar6,in_stack_ffffffffffffff70));
  return;
}

Assistant:

void ADPlanner::Recomputegval(ADState* state)
{
    vector<int> searchpredsIDV; //these are predecessors if search is done forward and successors otherwise
    vector<int> costV;
    CKey key;
    ADState *searchpredstate;

    if (bforwardsearch)
        environment_->GetPreds(state->MDPstate->StateID, &searchpredsIDV, &costV);
    else
        environment_->GetSuccs(state->MDPstate->StateID, &searchpredsIDV, &costV);

    //iterate through predecessors of s and pick the best
    state->g = INFINITECOST;
    for (int pind = 0; pind < (int)searchpredsIDV.size(); pind++) {
        //skip the states that do not exist - they can not be used to improve g-value anyway
        if (environment_->StateID2IndexMapping[searchpredsIDV[pind]][ADMDP_STATEID2IND] == -1) continue;

        CMDPSTATE* predMDPState = GetState(searchpredsIDV[pind], pSearchStateSpace_);
        int cost = costV[pind];
        searchpredstate = (ADState*)(predMDPState->PlannerSpecificData);

        //see if it can be used to improve
        if (searchpredstate->callnumberaccessed == pSearchStateSpace_->callnumber && state->g > searchpredstate->v
            + cost) {
            if (bforwardsearch) {
                state->g = searchpredstate->v + cost;
                state->bestpredstate = predMDPState;
            }
            else {
                state->g = searchpredstate->v + cost;
                state->bestnextstate = predMDPState;
                state->costtobestnextstate = cost;
            }
        }
    } //over preds
}